

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall google::LogMessage::SendToLog(LogMessage *this)

{
  char cVar1;
  int iVar2;
  int32 iVar3;
  LogMessageData *pLVar4;
  ulong uVar5;
  time_t tVar6;
  size_t sVar7;
  long *plVar8;
  LogMessage *pLVar9;
  bool bVar10;
  int iVar11;
  LogDestination *this_00;
  int i;
  long lVar12;
  ulong uVar13;
  ReaderMutexLock local_50;
  char *local_48;
  char *local_40;
  LogMessage *local_38;
  
  if ((SendToLog()::already_warned_before_initgoogle == '\0') &&
     (bVar10 = glog_internal_namespace_::IsGoogleLoggingInitialized(), !bVar10)) {
    SendToLog();
  }
  local_38 = this;
  if ((fLB::FLAGS_logtostderr == '\0') &&
     (bVar10 = glog_internal_namespace_::IsGoogleLoggingInitialized(), bVar10)) {
    pLVar4 = this->data_;
    cVar1 = pLVar4->severity_;
    uVar5 = pLVar4->num_chars_to_log_;
    if (fLB::FLAGS_logtostderr == '\0') {
      if (-1 < cVar1) {
        tVar6 = pLVar4->timestamp_;
        uVar13 = (ulong)(uint)(int)cVar1;
        do {
          lVar12 = (long)fLI::FLAGS_logbuflevel;
          if ((&LogDestination::log_destinations_)[uVar13] == 0) {
            this_00 = (LogDestination *)operator_new(0xe0);
            LogDestination::LogDestination(this_00,(LogSeverity)uVar13,(char *)0x0);
            (&LogDestination::log_destinations_)[uVar13] = this_00;
          }
          (**(code **)(**(long **)((&LogDestination::log_destinations_)[uVar13] + 0xd8) + 0x10))
                    (*(long **)((&LogDestination::log_destinations_)[uVar13] + 0xd8),
                     lVar12 < (long)uVar13,tVar6,pLVar4->message_text_,uVar5 & 0xffffffff);
          bVar10 = 0 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar10);
      }
    }
    else {
      ColoredWriteToStderr((int)cVar1,pLVar4->message_text_,uVar5);
    }
    pLVar9 = local_38;
    pLVar4 = local_38->data_;
    if ((fLI::FLAGS_stderrthreshold <= pLVar4->severity_) || (fLB::FLAGS_alsologtostderr == '\x01'))
    {
      ColoredWriteToStderr((int)pLVar4->severity_,pLVar4->message_text_,pLVar4->num_chars_to_log_);
    }
    pLVar4 = pLVar9->data_;
    LogDestination::MaybeLogToEmail
              ((int)pLVar4->severity_,pLVar4->message_text_,pLVar4->num_chars_to_log_);
    pLVar4 = pLVar9->data_;
    cVar1 = pLVar4->severity_;
    local_40 = pLVar4->fullname_;
    local_48 = pLVar4->basename_;
    iVar2 = pLVar4->line_;
    iVar3 = pLVar4->usecs_;
    uVar5 = pLVar4->num_prefix_chars_;
    sVar7 = pLVar4->num_chars_to_log_;
    local_50.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar11 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar11 != 0
       )) {
      abort();
    }
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar13 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar13 = uVar13 - 1;
        if ((int)(uint)uVar13 < 0) break;
        plVar8 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar13 & 0x7fffffff) * 8);
        (**(code **)(*plVar8 + 0x10))
                  (plVar8,(int)cVar1,local_40,local_48,iVar2,&pLVar4->tm_time_,
                   pLVar4->message_text_ + uVar5,~uVar5 + sVar7,iVar3);
      }
    }
  }
  else {
    pLVar4 = this->data_;
    ColoredWriteToStderr((int)pLVar4->severity_,pLVar4->message_text_,pLVar4->num_chars_to_log_);
    pLVar4 = this->data_;
    cVar1 = pLVar4->severity_;
    local_40 = pLVar4->fullname_;
    local_48 = pLVar4->basename_;
    iVar2 = pLVar4->line_;
    iVar3 = pLVar4->usecs_;
    uVar5 = pLVar4->num_prefix_chars_;
    sVar7 = pLVar4->num_chars_to_log_;
    local_50.mu_ = (Mutex *)LogDestination::sink_mutex_;
    if ((LogDestination::sink_mutex_[0x38] == '\x01') &&
       (iVar11 = pthread_rwlock_rdlock((pthread_rwlock_t *)LogDestination::sink_mutex_), iVar11 != 0
       )) goto LAB_001144cc;
    if (LogDestination::sinks_ != (long *)0x0) {
      uVar13 = (ulong)(LogDestination::sinks_[1] - *LogDestination::sinks_) >> 3;
      while( true ) {
        uVar13 = uVar13 - 1;
        if ((int)(uint)uVar13 < 0) break;
        plVar8 = *(long **)(*LogDestination::sinks_ + (ulong)((uint)uVar13 & 0x7fffffff) * 8);
        (**(code **)(*plVar8 + 0x10))
                  (plVar8,(int)cVar1,local_40,local_48,iVar2,&pLVar4->tm_time_,
                   pLVar4->message_text_ + uVar5,~uVar5 + sVar7,iVar3);
      }
    }
  }
  ::glog_internal_namespace_::ReaderMutexLock::~ReaderMutexLock(&local_50);
  pLVar9 = local_38;
  if ((local_38->data_->severity_ != '\x03') || (exit_on_dfatal != '\x01')) {
    return;
  }
  if (local_38->data_->first_fatal_ == true) {
    crash_reason._0_8_ = fatal_msg_data_exclusive._30496_8_;
    crash_reason._8_4_ = fatal_msg_data_exclusive._30364_4_;
    crash_reason._16_8_ = fatal_msg_data_exclusive._30464_8_ + 0x135bd4;
    crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,4);
    glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
    iVar2 = (int)pLVar9->data_->num_chars_to_log_;
    iVar11 = 0xff;
    if (iVar2 < 0xff) {
      iVar11 = iVar2;
    }
    memcpy(&fatal_message,pLVar9->data_->message_text_,(long)iVar11);
    (&fatal_message)[iVar11] = 0;
    fatal_time = pLVar9->data_->timestamp_;
  }
  if (fLB::FLAGS_logtostderr == '\0') {
    lVar12 = 0;
    do {
      if ((&LogDestination::log_destinations_)[lVar12] != 0) {
        plVar8 = *(long **)((&LogDestination::log_destinations_)[lVar12] + 0xd8);
        (**(code **)(*plVar8 + 0x10))(plVar8,1,0,"",0);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
  LogDestination::WaitForSinks(pLVar9->data_);
  write(2,"*** Check failure stack trace: ***\n",0x23);
  (*(code *)g_logging_fail_func)();
LAB_001144cc:
  abort();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  static bool already_warned_before_initgoogle = false;

  log_mutex.AssertHeld();

  RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
             data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");

  // Messages of a given severity get logged to lower severity logs, too

  if (!already_warned_before_initgoogle && !IsGoogleLoggingInitialized()) {
    const char w[] = "WARNING: Logging before InitGoogleLogging() is "
                     "written to STDERR\n";
    WriteToStderr(w, strlen(w));
    already_warned_before_initgoogle = true;
  }

  // global flag: never log to file if set.  Also -- don't log to a
  // file if we haven't parsed the command line flags to get the
  // program name.
  if (FLAGS_logtostderr || !IsGoogleLoggingInitialized()) {
    ColoredWriteToStderr(data_->severity_,
                         data_->message_text_, data_->num_chars_to_log_);

    // this could be protected by a flag if necessary.
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_ -
                                data_->num_prefix_chars_ - 1),
                               data_->usecs_);
  } else {

    // log this message to all log files of severity <= severity_
    LogDestination::LogToAllLogfiles(data_->severity_, data_->timestamp_,
                                     data_->message_text_,
                                     data_->num_chars_to_log_);

    LogDestination::MaybeLogToStderr(data_->severity_, data_->message_text_,
                                     data_->num_chars_to_log_);
    LogDestination::MaybeLogToEmail(data_->severity_, data_->message_text_,
                                    data_->num_chars_to_log_);
    LogDestination::LogToSinks(data_->severity_,
                               data_->fullname_, data_->basename_,
                               data_->line_, &data_->tm_time_,
                               data_->message_text_ + data_->num_prefix_chars_,
                               (data_->num_chars_to_log_
                                - data_->num_prefix_chars_ - 1),
                               data_->usecs_);
    // NOTE: -1 removes trailing \n
  }

  // If we log a FATAL message, flush all the log destinations, then toss
  // a signal for others to catch. We leave the logs in a state that
  // someone else can use them (as long as they flush afterwards)
  if (data_->severity_ == GLOG_FATAL && exit_on_dfatal) {
    if (data_->first_fatal_) {
      // Store crash information so that it is accessible from within signal
      // handlers that may be invoked later.
      RecordCrashReason(&crash_reason);
      SetCrashReason(&crash_reason);

      // Store shortened fatal message for other logs and GWQ status
      const int copy = min<int>(data_->num_chars_to_log_,
                                sizeof(fatal_message)-1);
      memcpy(fatal_message, data_->message_text_, copy);
      fatal_message[copy] = '\0';
      fatal_time = data_->timestamp_;
    }

    if (!FLAGS_logtostderr) {
      for (int i = 0; i < NUM_SEVERITIES; ++i) {
        if ( LogDestination::log_destinations_[i] )
          LogDestination::log_destinations_[i]->logger_->Write(true, 0, "", 0);
      }
    }

    // release the lock that our caller (directly or indirectly)
    // LogMessage::~LogMessage() grabbed so that signal handlers
    // can use the logging facility. Alternately, we could add
    // an entire unsafe logging interface to bypass locking
    // for signal handlers but this seems simpler.
    log_mutex.Unlock();
    LogDestination::WaitForSinks(data_);

    const char* message = "*** Check failure stack trace: ***\n";
    if (write(STDERR_FILENO, message, strlen(message)) < 0) {
      // Ignore errors.
    }
    Fail();
  }
}